

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::resize_bilinear_c1
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  short sVar1;
  short sVar2;
  ulong uVar3;
  int *piVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  short *psVar14;
  void *pvVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  uint uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  Mat rowsbuf0;
  Mat rowsbuf1;
  Mat local_c8;
  Mat local_78;
  
  uVar3 = (ulong)(uint)w;
  iVar6 = (h + w) * 2;
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar13 = (long)iVar6 * 4;
  }
  pvVar8 = operator_new__(uVar13);
  lVar9 = (long)w;
  lVar12 = (long)h;
  if (0 < w) {
    uVar13 = 0;
    do {
      fVar5 = ((float)(int)uVar13 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar22 = floorf(fVar5);
      iVar6 = (int)fVar22;
      fVar25 = 0.0;
      bVar20 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar20) {
        fVar25 = (fVar5 - (float)(int)fVar22) * 2048.0;
      }
      iVar7 = iVar6;
      if (srcw + -1 <= iVar6) {
        iVar7 = srcw + -2;
      }
      *(int *)((long)pvVar8 + uVar13 * 4) = iVar7;
      if (srcw + -1 <= iVar6) {
        fVar25 = 2048.0;
      }
      uVar21 = -(uint)(0.0 <= 2048.0 - fVar25);
      auVar23._0_4_ = (int)((float)(uVar21 & 0x3f000000 | ~uVar21 & 0xbf000000) + (2048.0 - fVar25))
      ;
      auVar23._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar25) & 0x3f000000 | ~-(uint)(0.0 <= fVar25) & 0xbf000000)
                + fVar25);
      auVar23._8_8_ = 0;
      auVar23 = packssdw(auVar23,auVar23);
      *(int *)((long)pvVar8 + uVar13 * 4 + lVar12 * 4 + lVar9 * 4) = auVar23._0_4_;
      uVar13 = uVar13 + 1;
    } while (uVar3 != uVar13);
  }
  psVar14 = (short *)((long)pvVar8 + lVar12 * 4 + lVar9 * 8);
  if (0 < h) {
    uVar13 = 0;
    do {
      fVar5 = ((float)(int)uVar13 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar22 = floorf(fVar5);
      iVar6 = (int)fVar22;
      fVar25 = 0.0;
      bVar20 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar20) {
        fVar25 = (fVar5 - (float)(int)fVar22) * 2048.0;
      }
      iVar7 = iVar6;
      if (srch + -1 <= iVar6) {
        iVar7 = srch + -2;
      }
      *(int *)((long)pvVar8 + uVar13 * 4 + lVar9 * 4) = iVar7;
      if (srch + -1 <= iVar6) {
        fVar25 = 2048.0;
      }
      uVar21 = -(uint)(0.0 <= 2048.0 - fVar25);
      auVar24._0_4_ = (int)((float)(uVar21 & 0x3f000000 | ~uVar21 & 0xbf000000) + (2048.0 - fVar25))
      ;
      auVar24._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar25) & 0x3f000000 | ~-(uint)(0.0 <= fVar25) & 0xbf000000)
                + fVar25);
      auVar24._8_8_ = 0;
      auVar23 = packssdw(auVar24,auVar24);
      *(int *)(psVar14 + uVar13 * 2) = auVar23._0_4_;
      uVar13 = uVar13 + 1;
    } while ((uint)h != uVar13);
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,w,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,w,2,(Allocator *)0x0);
  if (0 < h) {
    lVar12 = lVar12 * 4 + lVar9 * 4;
    uVar13 = 0;
    pvVar10 = local_c8.data;
    pvVar15 = local_78.data;
    iVar6 = -2;
    do {
      iVar7 = *(int *)((long)pvVar8 + uVar13 * 4 + lVar9 * 4);
      pvVar11 = pvVar10;
      if (iVar7 != iVar6) {
        if (iVar7 == iVar6 + 1) {
          pvVar11 = pvVar15;
          pvVar15 = pvVar10;
          if (0 < w) {
            iVar6 = (iVar7 + 1) * srcstride;
            uVar16 = 0;
            do {
              lVar17 = (long)*(int *)((long)pvVar8 + uVar16 * 4);
              *(short *)((long)pvVar10 + uVar16 * 2) =
                   (short)((uint)src[lVar17 + (long)iVar6 + 1] *
                           (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar12 + 2) +
                           (uint)src[lVar17 + iVar6] *
                           (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar12) >> 4);
              uVar16 = uVar16 + 1;
            } while (uVar3 != uVar16);
          }
        }
        else if (0 < w) {
          iVar6 = (iVar7 + 1) * srcstride;
          uVar16 = 0;
          do {
            lVar17 = (long)*(int *)((long)pvVar8 + uVar16 * 4);
            iVar19 = (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar12);
            iVar18 = (int)*(short *)((long)pvVar8 + uVar16 * 4 + lVar12 + 2);
            *(short *)((long)pvVar10 + uVar16 * 2) =
                 (short)((uint)src[lVar17 + (long)(iVar7 * srcstride) + 1] * iVar18 +
                         (uint)src[lVar17 + iVar7 * srcstride] * iVar19 >> 4);
            *(short *)((long)pvVar15 + uVar16 * 2) =
                 (short)((uint)src[lVar17 + (long)iVar6 + 1] * iVar18 +
                         (uint)src[lVar17 + iVar6] * iVar19 >> 4);
            uVar16 = uVar16 + 1;
          } while (uVar3 != uVar16);
        }
      }
      if (w != 0) {
        sVar1 = psVar14[1];
        sVar2 = *psVar14;
        lVar17 = 0;
        do {
          dst[lVar17] = (uchar)(((uint)((int)*(short *)((long)pvVar11 + lVar17 * 2) * (int)sVar2) >>
                                0x10) + ((uint)((int)*(short *)((long)pvVar15 + lVar17 * 2) *
                                               (int)sVar1) >> 0x10) + 2 >> 2);
          lVar17 = lVar17 + 1;
        } while (w != (int)lVar17);
      }
      psVar14 = psVar14 + 2;
      uVar13 = uVar13 + 1;
      dst = dst + stride;
      pvVar10 = pvVar11;
      iVar6 = iVar7;
    } while (uVar13 != (uint)h);
  }
  operator_delete__(pvVar8);
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c1(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;
    //     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
                rows1p[dx] = (S1p[0] * a0 + S1p[1] * a1) >> 4;

                ialphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
                rows0p[dx] = (S0p[0] * a0 + S0p[1] * a1) >> 4;
                rows1p[dx] = (S1p[0] * a0 + S1p[1] * a1) >> 4;

                ialphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = w >> 3;
#else
        int nn = 0;
#endif
        int remain = w - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn > 0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p + 4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p + 4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "vdup.s16   d16, %8         \n"
                "mov        r4, #2          \n"
                "vdup.s16   d17, %9         \n"
                "vdup.s32   q12, r4         \n"
                "pld        [%0, #128]      \n"
                "vld1.s16   {d2-d3}, [%0 :128]!\n"
                "pld        [%1, #128]      \n"
                "vld1.s16   {d6-d7}, [%1 :128]!\n"
                "0:                         \n"
                "vmull.s16  q0, d2, d16     \n"
                "vmull.s16  q1, d3, d16     \n"
                "vorr.s32   q10, q12, q12   \n"
                "vorr.s32   q11, q12, q12   \n"
                "vmull.s16  q2, d6, d17     \n"
                "vmull.s16  q3, d7, d17     \n"
                "vsra.s32   q10, q0, #16    \n"
                "vsra.s32   q11, q1, #16    \n"
                "pld        [%0, #128]      \n"
                "vld1.s16   {d2-d3}, [%0 :128]!\n"
                "vsra.s32   q10, q2, #16    \n"
                "vsra.s32   q11, q3, #16    \n"
                "pld        [%1, #128]      \n"
                "vld1.s16   {d6-d7}, [%1 :128]!\n"
                "vshrn.s32  d20, q10, #2    \n"
                "vshrn.s32  d21, q11, #2    \n"
                "vqmovun.s16 d20, q10        \n"
                "vst1.8     {d20}, [%2]!    \n"
                "subs       %3, #1          \n"
                "bne        0b              \n"
                "sub        %0, #16         \n"
                "sub        %1, #16         \n"
                : "=r"(rows0p), // %0
                "=r"(rows1p), // %1
                "=r"(Dp),     // %2
                "=r"(nn)      // %3
                : "0"(rows0p),
                "1"(rows1p),
                "2"(Dp),
                "3"(nn),
                "r"(b0), // %8
                "r"(b1)  // %9
                : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain; --remain)
        {
            //             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(((short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2) >> 2);
        }

        ibeta += 2;
    }

    delete[] buf;
}